

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t * o_xchar(wchar_t oid)

{
  object_kind *poVar1;
  wchar_t *pwVar2;
  uint *puVar3;
  wchar_t **ppwVar4;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    pwVar2 = (wchar_t *)0x0;
  }
  else {
    if ((poVar1->flavor == (flavor *)0x0) || (poVar1->aware == true)) {
      puVar3 = &poVar1->kidx;
      ppwVar4 = &kind_x_char;
    }
    else {
      puVar3 = &poVar1->flavor->fidx;
      ppwVar4 = &flavor_x_char;
    }
    pwVar2 = *ppwVar4 + *puVar3;
  }
  return pwVar2;
}

Assistant:

static wchar_t *o_xchar(int oid)
{
	struct object_kind *kind = objkind_byid(oid);
	if (!kind) return 0;

	if (!kind->flavor || kind->aware)
		return &kind_x_char[kind->kidx];
	else
		return &flavor_x_char[kind->flavor->fidx];
}